

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O1

void __thiscall DScroller::Tick(DScroller *this)

{
  EScrollPos EVar1;
  int iVar2;
  TVector2<double> *pTVar3;
  splane *psVar4;
  side_t *psVar5;
  long lVar6;
  double *pdVar7;
  double dx;
  double dy;
  double dVar8;
  double dVar9;
  double tdy;
  double tdx;
  double local_30;
  double local_28;
  
  dx = this->m_dx;
  dy = this->m_dy;
  lVar6 = (long)this->m_Control;
  if (lVar6 != -1) {
    dVar8 = sectors[lVar6].centerspot.X;
    dVar9 = sectors[lVar6].centerspot.Y;
    dVar9 = (dVar9 * sectors[lVar6].ceilingplane.normal.Y +
            dVar8 * sectors[lVar6].ceilingplane.normal.X + sectors[lVar6].ceilingplane.D) *
            sectors[lVar6].ceilingplane.negiC +
            (sectors[lVar6].floorplane.normal.Y * dVar9 +
            sectors[lVar6].floorplane.normal.X * dVar8 + sectors[lVar6].floorplane.D) *
            sectors[lVar6].floorplane.negiC;
    dVar8 = dVar9 - this->m_LastHeight;
    this->m_LastHeight = dVar9;
    dx = dx * dVar8;
    dy = dy * dVar8;
  }
  if (this->m_Accel != 0) {
    dx = dx + this->m_vdx;
    this->m_vdx = dx;
    dy = dy + this->m_vdy;
    this->m_vdy = dy;
  }
  psVar5 = sides;
  if ((((dx == 0.0) && (!NAN(dx))) && (dy == 0.0)) && (!NAN(dy))) {
    return;
  }
  switch(this->m_Type) {
  case sc_side:
    EVar1 = this->m_Parts;
    if ((EVar1 & scw_top) != 0) {
      iVar2 = this->m_Affectee;
      sides[iVar2].textures[0].xOffset = sides[iVar2].textures[0].xOffset + dx;
      psVar5[iVar2].textures[0].yOffset = psVar5[iVar2].textures[0].yOffset + dy;
    }
    psVar5 = sides;
    if ((EVar1 & scw_mid) != 0) {
      iVar2 = this->m_Affectee;
      if (((sides[iVar2].linedef)->backsector == (sector_t_conflict *)0x0) ||
         (((sides[iVar2].linedef)->flags & 0x200000) == 0)) {
        sides[iVar2].textures[1].xOffset = sides[iVar2].textures[1].xOffset + dx;
        psVar5[iVar2].textures[1].yOffset = psVar5[iVar2].textures[1].yOffset + dy;
      }
    }
    if ((EVar1 & scw_bottom) == 0) {
      return;
    }
    pTVar3 = (TVector2<double> *)(sides[this->m_Affectee].textures + 2);
    break;
  case sc_floor:
    RotationComp(sectors + this->m_Affectee,0,dx,dy,&local_28,&local_30);
    psVar4 = sectors[this->m_Affectee].planes;
    goto LAB_00441858;
  case sc_ceiling:
    RotationComp(sectors + this->m_Affectee,1,dx,dy,&local_28,&local_30);
    psVar4 = sectors[this->m_Affectee].planes + 1;
LAB_00441858:
    pdVar7 = &(psVar4->xform).yOffs;
    (psVar4->xform).xOffs = local_28 + (psVar4->xform).xOffs;
    goto LAB_00441867;
  case sc_carry:
    pTVar3 = level.Scrolls.Array + this->m_Affectee;
    break;
  default:
    goto switchD_004416e2_default;
  }
  pdVar7 = &pTVar3->Y;
  ((TVector2<double> *)(pdVar7 + -1))->X = dx + ((TVector2<double> *)(pdVar7 + -1))->X;
  local_30 = dy;
LAB_00441867:
  *pdVar7 = local_30 + *pdVar7;
switchD_004416e2_default:
  return;
}

Assistant:

void DScroller::Tick ()
{
	double dx = m_dx, dy = m_dy, tdx, tdy;

	if (m_Control != -1)
	{	// compute scroll amounts based on a sector's height changes
		double height = sectors[m_Control].CenterFloor () +
						 sectors[m_Control].CenterCeiling ();
		double delta = height - m_LastHeight;
		m_LastHeight = height;
		dx *= delta;
		dy *= delta;
	}

	// killough 3/14/98: Add acceleration
	if (m_Accel)
	{
		m_vdx = dx += m_vdx;
		m_vdy = dy += m_vdy;
	}

	if (dx == 0 && dy == 0)
		return;

	switch (m_Type)
	{
		case EScroll::sc_side:					// killough 3/7/98: Scroll wall texture
			if (m_Parts & EScrollPos::scw_top)
			{
				sides[m_Affectee].AddTextureXOffset(side_t::top, dx);
				sides[m_Affectee].AddTextureYOffset(side_t::top, dy);
			}
			if (m_Parts & EScrollPos::scw_mid && (sides[m_Affectee].linedef->backsector == NULL ||
				!(sides[m_Affectee].linedef->flags&ML_3DMIDTEX)))
			{
				sides[m_Affectee].AddTextureXOffset(side_t::mid, dx);
				sides[m_Affectee].AddTextureYOffset(side_t::mid, dy);
			}
			if (m_Parts & EScrollPos::scw_bottom)
			{
				sides[m_Affectee].AddTextureXOffset(side_t::bottom, dx);
				sides[m_Affectee].AddTextureYOffset(side_t::bottom, dy);
			}
			break;

		case EScroll::sc_floor:						// killough 3/7/98: Scroll floor texture
			RotationComp(&sectors[m_Affectee], sector_t::floor, dx, dy, tdx, tdy);
			sectors[m_Affectee].AddXOffset(sector_t::floor, tdx);
			sectors[m_Affectee].AddYOffset(sector_t::floor, tdy);
			break;

		case EScroll::sc_ceiling:					// killough 3/7/98: Scroll ceiling texture
			RotationComp(&sectors[m_Affectee], sector_t::ceiling, dx, dy, tdx, tdy);
			sectors[m_Affectee].AddXOffset(sector_t::ceiling, tdx);
			sectors[m_Affectee].AddYOffset(sector_t::ceiling, tdy);
			break;

		// [RH] Don't actually carry anything here. That happens later.
		case EScroll::sc_carry:
			level.Scrolls[m_Affectee].X += dx;
			level.Scrolls[m_Affectee].Y += dy;
			break;

		case EScroll::sc_carry_ceiling:       // to be added later
			break;
	}
}